

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf-hash.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  byte bVar7;
  int i;
  int iVar8;
  XXH_errorcode XVar9;
  uint uVar10;
  hash_manifest_result_t hVar11;
  istream *piVar12;
  XXH64_state_t *statePtr;
  undefined8 uVar13;
  ulong uVar14;
  char *pcVar15;
  long lVar16;
  XXH64_hash_t XVar17;
  undefined8 uVar18;
  undefined7 uVar20;
  invalid_argument *piVar19;
  uchar *puVar21;
  string *digest;
  ulong uVar22;
  int iVar23;
  byte *pbVar24;
  size_t sVar25;
  ulong uVar26;
  uchar *puVar27;
  allocator<char> local_59e;
  char local_59d [4];
  allocator<char> local_599;
  undefined8 local_598;
  ulong local_590;
  ulong local_588;
  hash_params params;
  string tensor_layer_name;
  uchar uuidv5_namespace [16];
  undefined1 local_508 [17];
  undefined4 uStack_4f7;
  undefined4 uStack_4f3;
  undefined7 uStack_4ef;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined1 local_4d8;
  char result [21];
  uchar result_1 [32];
  ggml_context *ctx_data;
  char hex_result [17];
  string manifest_entry_line;
  string arg;
  string arg_prefix;
  
  params.input._M_dataplus._M_p = (pointer)&params.input.field_2;
  params.input._M_string_length = 0;
  params.input.field_2._M_local_buf[0] = '\0';
  params.manifest_file._M_dataplus._M_p = (pointer)&params.manifest_file.field_2;
  params.xxh64 = false;
  params.sha1 = false;
  params.sha256 = false;
  params.uuid = false;
  params.no_layer = false;
  params.manifest_is_usable = false;
  params.manifest_file._M_string_length = 0;
  params.manifest_file.field_2._M_local_buf[0] = '\0';
  local_59d[2] = '\0';
  local_59d[1] = 0;
  local_59d[3] = '\0';
  local_59d[0] = '\0';
  arg._M_dataplus._M_p = (pointer)&arg.field_2;
  arg._M_string_length = 0;
  arg.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&arg_prefix,"--",(allocator<char> *)&manifest_entry_line);
  iVar23 = 1;
  while( true ) {
    if (argc <= iVar23) {
      piVar19 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar19,"error: bad arguments");
      __cxa_throw(piVar19,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    if ((*argv[iVar23] != '-') || (argv[iVar23][1] != '-')) break;
    std::__cxx11::string::assign((char *)&arg);
    iVar8 = std::__cxx11::string::compare((ulong)&arg,0,(string *)arg_prefix._M_string_length);
    if (iVar8 == 0) {
      manifest_entry_line._M_dataplus._M_p._0_1_ = 0x5f;
      uuidv5_namespace[0] = '-';
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )arg._M_dataplus._M_p,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(arg._M_dataplus._M_p + arg._M_string_length),(char *)&manifest_entry_line,
                 (char *)uuidv5_namespace);
    }
    bVar4 = std::operator==(&arg,"-h");
    if ((bVar4) || (bVar4 = std::operator==(&arg,"--help"), bVar4)) {
      hash_print_usage(*argv);
      exit(0);
    }
    bVar4 = std::operator==(&arg,"--xxh64");
    if (bVar4) {
      params.xxh64 = true;
    }
    bVar5 = std::operator==(&arg,"--sha1");
    if (bVar5) {
      params.sha1 = true;
      bVar4 = true;
    }
    bVar5 = std::operator==(&arg,"--uuid");
    if (bVar5) {
      params.uuid = true;
      bVar4 = true;
    }
    bVar5 = std::operator==(&arg,"--sha256");
    if (bVar5) {
      params.sha256 = true;
      bVar4 = true;
    }
    bVar5 = std::operator==(&arg,"--all");
    if (bVar5) {
      params.xxh64 = false;
      params.sha1 = false;
      params.sha256 = true;
      params.xxh64 = true;
      params.sha1 = true;
      bVar4 = true;
    }
    bVar5 = std::operator==(&arg,"--no-layer");
    if (bVar5) {
      params.no_layer = true;
      bVar4 = true;
    }
    bVar5 = std::operator==(&arg,"-c");
    if ((bVar5) || (bVar5 = std::operator==(&arg,"--check"), bVar5)) {
      iVar23 = iVar23 + 1;
      if (argc <= iVar23) {
        piVar19 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::operator+(&manifest_entry_line,"error: invalid parameter for argument:",&arg);
        std::invalid_argument::invalid_argument(piVar19,(string *)&manifest_entry_line);
        __cxa_throw(piVar19,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      std::__cxx11::string::assign((char *)&params.manifest_file);
    }
    else if (bVar4 == false) {
      piVar19 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(&manifest_entry_line,"error: unknown argument: ",&arg);
      std::invalid_argument::invalid_argument(piVar19,(string *)&manifest_entry_line);
      __cxa_throw(piVar19,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    iVar23 = iVar23 + 1;
  }
  std::__cxx11::string::assign((char *)&params);
  std::__cxx11::string::~string((string *)&arg_prefix);
  std::__cxx11::string::~string((string *)&arg);
  if (params.manifest_file._M_string_length == 0) {
    bVar7 = params.xxh64;
  }
  else {
    std::ifstream::ifstream(&arg,(string *)&params.manifest_file,_S_in);
    cVar6 = std::__basic_file<char>::is_open();
    if (cVar6 == '\0') {
      std::ifstream::~ifstream(&arg);
      printf("ERROR cannot open manifest %s",params.manifest_file._M_dataplus._M_p);
      uVar10 = 5;
      goto LAB_00103731;
    }
    manifest_entry_line._M_dataplus._M_p = (pointer)&manifest_entry_line.field_2;
    manifest_entry_line._M_string_length = 0;
    manifest_entry_line.field_2._M_local_buf[0] = '\0';
    while (piVar12 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               ((istream *)&arg,(string *)&manifest_entry_line),
          ((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) == 0) {
      std::__cxx11::istringstream::istringstream
                ((istringstream *)&arg_prefix,(string *)&manifest_entry_line,_S_in);
      uuidv5_namespace[8] = '\0';
      uuidv5_namespace[9] = '\0';
      uuidv5_namespace[10] = '\0';
      uuidv5_namespace[0xb] = '\0';
      uuidv5_namespace[0xc] = '\0';
      uuidv5_namespace[0xd] = '\0';
      uuidv5_namespace[0xe] = '\0';
      uuidv5_namespace[0xf] = '\0';
      local_508._0_8_ = local_508._0_8_ & 0xffffffffffffff00;
      uuidv5_namespace._0_8_ = local_508;
      piVar12 = std::operator>>((istream *)&arg_prefix,(string *)uuidv5_namespace);
      if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) == 0) {
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )uuidv5_namespace,"sha256");
        pcVar15 = local_59d + 3;
        if (!bVar4) {
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)uuidv5_namespace,"sha1");
          pcVar15 = local_59d + 1;
          if (!bVar4) {
            bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)uuidv5_namespace,"xxh64");
            pcVar15 = local_59d + 2;
            if (!bVar4) {
              bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)uuidv5_namespace,"uuid");
              pcVar15 = local_59d;
              if (!bVar4) goto LAB_001027b4;
            }
          }
        }
        *pcVar15 = '\x01';
      }
LAB_001027b4:
      std::__cxx11::string::~string((string *)uuidv5_namespace);
      std::__cxx11::istringstream::~istringstream((istringstream *)&arg_prefix);
    }
    std::__cxx11::string::~string((string *)&manifest_entry_line);
    std::ifstream::~ifstream(&arg);
    cVar6 = local_59d[3];
    bVar1 = local_59d[1];
    if (local_59d[3] == '\0') {
      if (((local_59d[1] == 0) && (local_59d[2] == '\0')) && (local_59d[0] == '\0')) {
        printf("ERROR manifest does not have any known hash format in %s",
               params.manifest_file._M_dataplus._M_p);
        uVar10 = 4;
        goto LAB_00103731;
      }
      printf("manifest  %s");
    }
    else {
      printf("manifest  %s");
      bVar1 = local_59d[1];
      printf("  sha256");
    }
    if ((bVar1 & 1) != 0) {
      printf("  sha1");
    }
    cVar3 = local_59d[2];
    if (local_59d[2] == '\x01') {
      printf("  xxh64");
    }
    cVar2 = local_59d[0];
    if (local_59d[0] == '\x01') {
      printf("  uuid");
    }
    putchar(10);
    bVar7 = params.xxh64;
    if (((params.xxh64 == false) && (params.sha1 == false)) &&
       ((params.uuid == false && (params.sha256 == false)))) {
      if (cVar6 == '\0') {
        if ((bVar1 & 1) == 0) {
          if (cVar3 == '\0') {
            if (cVar2 != '\0') {
              params.uuid = true;
            }
          }
          else {
            params.xxh64 = true;
            bVar7 = 1;
          }
        }
        else {
          params.xxh64 = false;
          params.sha1 = true;
        }
      }
      else {
        params.sha256 = true;
        params.uuid = false;
      }
    }
    params.manifest_is_usable = true;
  }
  if ((((bVar7 & 1) == 0) && (params.sha1 == false)) &&
     ((params.uuid == false && (params.sha256 == false)))) {
    params.xxh64 = true;
LAB_00102957:
    ctx_data = (ggml_context *)0x0;
    statePtr = XXH64_createState();
    if (statePtr == (XXH64_state_t *)0x0) {
      abort();
    }
    XVar9 = XXH64_reset(statePtr,0);
    if (XVar9 == XXH_ERROR) {
      abort();
    }
  }
  else {
    ctx_data = (ggml_context *)0x0;
    if ((bVar7 & 1) != 0) goto LAB_00102957;
    statePtr = (XXH64_state_t *)0x0;
  }
  if (params.sha1 == true) {
    SHA1Init((SHA1_CTX *)&arg_prefix);
  }
  if (params.sha256 == true) {
    sha256_init((sha256_t *)&arg);
  }
  if (params.uuid == true) {
    uuidv5_namespace[0] = 0xef;
    uuidv5_namespace[1] = '\0';
    uuidv5_namespace[2] = '\x12';
    uuidv5_namespace[3] = '\x06';
    uuidv5_namespace[4] = 0xda;
    uuidv5_namespace[5] = 0xdc;
    uuidv5_namespace[6] = '_';
    uuidv5_namespace[7] = 'm';
    uuidv5_namespace[8] = 0xa1;
    uuidv5_namespace[9] = '_';
    uuidv5_namespace[10] = '3';
    uuidv5_namespace[0xb] = 'Y';
    uuidv5_namespace[0xc] = 0xe5;
    uuidv5_namespace[0xd] = 'w';
    uuidv5_namespace[0xe] = 0xd4;
    uuidv5_namespace[0xf] = 0xe5;
    SHA1Init((SHA1_CTX *)&manifest_entry_line);
    SHA1Update((SHA1_CTX *)&manifest_entry_line,uuidv5_namespace,0x10);
  }
  uVar13 = gguf_init_from_file(params.input._M_dataplus._M_p,0,&ctx_data);
  uVar10 = gguf_get_n_tensors(uVar13);
  uVar14 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    uVar14 = 0;
  }
  uVar26 = 0;
  local_590 = 0;
  for (uVar22 = 0; uVar22 != uVar14; uVar22 = uVar22 + 1) {
    pcVar15 = (char *)gguf_get_tensor_name(uVar13);
    lVar16 = ggml_get_tensor(ctx_data,pcVar15);
    local_598 = (uchar *)ggml_nbytes(lVar16);
    puVar27 = *(uchar **)(lVar16 + 0xf8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   uuidv5_namespace,&params.input,":");
    std::operator+(&tensor_layer_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   uuidv5_namespace,pcVar15);
    std::__cxx11::string::~string((string *)uuidv5_namespace);
    if (params.xxh64 == true) {
      if (params.no_layer == false) {
        local_588 = uVar26;
        XVar17 = XXH64(puVar27,(size_t)local_598,0);
        bVar7 = 0x38;
        pcVar15 = hex_result;
        for (sVar25 = 0x11; sVar25 != 1; sVar25 = sVar25 - 2) {
          snprintf(pcVar15,sVar25,"%02x",XVar17 >> (bVar7 & 0x3f) & 0xff);
          pcVar15 = pcVar15 + 2;
          bVar7 = bVar7 - 8;
        }
        if (params.manifest_is_usable == false) {
          printf("%-8s  %-s  %s\n","xxh64",hex_result,tensor_layer_name._M_dataplus._M_p);
          uVar26 = local_588;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)uuidv5_namespace,"xxh64",(allocator<char> *)result);
          uVar26 = local_588;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)result_1,hex_result,&local_59e);
          hVar11 = manifest_verify(&params.manifest_file,(string *)uuidv5_namespace,
                                   (string *)result_1,&tensor_layer_name);
          std::__cxx11::string::~string((string *)result_1);
          uVar18 = std::__cxx11::string::~string((string *)uuidv5_namespace);
          uVar20 = (undefined7)((ulong)uVar18 >> 8);
          if (hVar11 == HASH_MANIFEST_MISMATCH) {
            local_590 = CONCAT71(uVar20,1);
            uVar26 = CONCAT71((int7)(uVar26 >> 8),1);
            pcVar15 = "Mismatch";
          }
          else if (hVar11 == HASH_MANIFEST_OK) {
            local_590 = CONCAT71(uVar20,1);
            pcVar15 = "Ok";
          }
          else {
            pcVar15 = "?";
            if (hVar11 == HASH_MANIFEST_NOT_FOUND) {
              pcVar15 = "Not Found";
            }
          }
          printf("%-8s  %-s  %s  -  %s\n","xxh64",hex_result,tensor_layer_name._M_dataplus._M_p,
                 pcVar15);
        }
      }
      XVar9 = XXH64_update(statePtr,puVar27,(size_t)local_598);
      if (XVar9 == XXH_ERROR) {
        abort();
      }
    }
    if (params.sha1 == true) {
      if (params.no_layer != true) {
        pbVar24 = (byte *)result;
        SHA1(pbVar24,(size_t)puVar27,local_598);
        uStack_4f7 = 0;
        uStack_4f3 = 0;
        local_508._0_8_ = 0;
        local_508[8] = '\0';
        local_508._9_4_ = 0;
        local_508._13_4_ = 0;
        uuidv5_namespace[0] = '\0';
        uuidv5_namespace[1] = '\0';
        uuidv5_namespace[2] = '\0';
        uuidv5_namespace[3] = '\0';
        uuidv5_namespace[4] = '\0';
        uuidv5_namespace[5] = '\0';
        uuidv5_namespace[6] = '\0';
        uuidv5_namespace[7] = '\0';
        uuidv5_namespace[8] = '\0';
        uuidv5_namespace[9] = '\0';
        uuidv5_namespace[10] = '\0';
        uuidv5_namespace[0xb] = '\0';
        uuidv5_namespace[0xc] = '\0';
        uuidv5_namespace[0xd] = '\0';
        uuidv5_namespace[0xe] = '\0';
        uuidv5_namespace[0xf] = '\0';
        puVar21 = uuidv5_namespace;
        for (sVar25 = 0x29; sVar25 != 1; sVar25 = sVar25 - 2) {
          snprintf((char *)puVar21,sVar25,"%02x",(ulong)*pbVar24);
          pbVar24 = pbVar24 + 1;
          puVar21 = puVar21 + 2;
        }
        if (params.manifest_is_usable == false) {
          printf("%-8s  %-s  %s\n","sha1",uuidv5_namespace,tensor_layer_name._M_dataplus._M_p);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>((string *)result_1,"sha1",&local_59e);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)hex_result,(char *)uuidv5_namespace,
                     (allocator<char> *)(local_59d + 4));
          hVar11 = manifest_verify(&params.manifest_file,(string *)result_1,(string *)hex_result,
                                   &tensor_layer_name);
          std::__cxx11::string::~string((string *)hex_result);
          uVar18 = std::__cxx11::string::~string((string *)result_1);
          uVar20 = (undefined7)((ulong)uVar18 >> 8);
          if (hVar11 == HASH_MANIFEST_MISMATCH) {
            local_590 = CONCAT71(uVar20,1);
            uVar26 = CONCAT71((int7)(uVar26 >> 8),1);
            pcVar15 = "Mismatch";
          }
          else if (hVar11 == HASH_MANIFEST_OK) {
            local_590 = CONCAT71(uVar20,1);
            pcVar15 = "Ok";
          }
          else {
            pcVar15 = "?";
            if (hVar11 == HASH_MANIFEST_NOT_FOUND) {
              pcVar15 = "Not Found";
            }
          }
          printf("%-8s  %-s  %s  -  %s\n","sha1",uuidv5_namespace,tensor_layer_name._M_dataplus._M_p
                 ,pcVar15);
        }
      }
      SHA1Update((SHA1_CTX *)&arg_prefix,puVar27,(uint32_t)local_598);
    }
    if (params.sha256 == true) {
      if (params.no_layer == false) {
        pbVar24 = result_1;
        sha256_hash(pbVar24,puVar27,(size_t)local_598);
        local_4e8 = 0;
        uStack_4e0 = 0;
        uStack_4f7 = 0;
        uStack_4f3 = 0;
        uStack_4ef = 0;
        local_508._0_8_ = 0;
        local_508[8] = '\0';
        local_508._9_4_ = 0;
        local_508._13_4_ = 0;
        uuidv5_namespace[0] = '\0';
        uuidv5_namespace[1] = '\0';
        uuidv5_namespace[2] = '\0';
        uuidv5_namespace[3] = '\0';
        uuidv5_namespace[4] = '\0';
        uuidv5_namespace[5] = '\0';
        uuidv5_namespace[6] = '\0';
        uuidv5_namespace[7] = '\0';
        uuidv5_namespace[8] = '\0';
        uuidv5_namespace[9] = '\0';
        uuidv5_namespace[10] = '\0';
        uuidv5_namespace[0xb] = '\0';
        uuidv5_namespace[0xc] = '\0';
        uuidv5_namespace[0xd] = '\0';
        uuidv5_namespace[0xe] = '\0';
        uuidv5_namespace[0xf] = '\0';
        local_4d8 = 0;
        puVar21 = uuidv5_namespace;
        for (sVar25 = 0x41; sVar25 != 1; sVar25 = sVar25 - 2) {
          snprintf((char *)puVar21,sVar25,"%02x",(ulong)*pbVar24);
          pbVar24 = pbVar24 + 1;
          puVar21 = puVar21 + 2;
        }
        if (params.manifest_is_usable == false) {
          printf("%-8s  %-s  %s\n","sha256",uuidv5_namespace,tensor_layer_name._M_dataplus._M_p);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)hex_result,"sha256",&local_59e);
          local_588 = uVar26;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)result,(char *)uuidv5_namespace,(allocator<char> *)(local_59d + 4));
          hVar11 = manifest_verify(&params.manifest_file,(string *)hex_result,(string *)result,
                                   &tensor_layer_name);
          std::__cxx11::string::~string((string *)result);
          uVar18 = std::__cxx11::string::~string((string *)hex_result);
          uVar20 = (undefined7)((ulong)uVar18 >> 8);
          if (hVar11 == HASH_MANIFEST_MISMATCH) {
            local_590 = CONCAT71(uVar20,1);
            pcVar15 = "Mismatch";
            uVar26 = CONCAT71((int7)((ulong)result >> 8),1);
          }
          else {
            uVar26 = local_588;
            if (hVar11 == HASH_MANIFEST_OK) {
              local_590 = CONCAT71(uVar20,1);
              pcVar15 = "Ok";
            }
            else {
              pcVar15 = "?";
              if (hVar11 == HASH_MANIFEST_NOT_FOUND) {
                pcVar15 = "Not Found";
              }
            }
          }
          printf("%-8s  %-s  %s  -  %s\n","sha256",uuidv5_namespace,
                 tensor_layer_name._M_dataplus._M_p,pcVar15);
        }
      }
      sha256_update((sha256_t *)&arg,puVar27,(size_t)local_598);
    }
    if (params.uuid == true) {
      SHA1Update((SHA1_CTX *)&manifest_entry_line,puVar27,(uint32_t)local_598);
    }
    std::__cxx11::string::~string((string *)&tensor_layer_name);
  }
  bVar7 = 0;
  local_598 = (uchar *)((ulong)local_598 & 0xffffffff00000000);
  if (params.xxh64 != false) {
    XVar17 = XXH64_digest(statePtr);
    puVar27 = result_1;
    bVar7 = 0x38;
    for (sVar25 = 0x11; sVar25 != 1; sVar25 = sVar25 - 2) {
      snprintf((char *)puVar27,sVar25,"%02x",XVar17 >> (bVar7 & 0x3f) & 0xff);
      puVar27 = puVar27 + 2;
      bVar7 = bVar7 - 8;
    }
    if (params.manifest_is_usable == false) {
      printf("%-8s  %-s  %s\n","xxh64",result_1,params.input._M_dataplus._M_p);
      local_598 = (uchar *)((ulong)local_598 & 0xffffffff00000000);
      bVar7 = 0;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)uuidv5_namespace,"xxh64",(allocator<char> *)hex_result);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&tensor_layer_name,(char *)result_1,(allocator<char> *)result);
      hVar11 = manifest_verify(&params.manifest_file,(string *)uuidv5_namespace,&tensor_layer_name,
                               &params.input);
      std::__cxx11::string::~string((string *)&tensor_layer_name);
      uVar18 = std::__cxx11::string::~string((string *)uuidv5_namespace);
      uVar20 = (undefined7)((ulong)uVar18 >> 8);
      if (hVar11 == HASH_MANIFEST_MISMATCH) {
        pcVar15 = "Mismatch";
        local_598 = (uchar *)CONCAT44(local_598._4_4_,(int)CONCAT71(uVar20,1));
        bVar7 = 1;
      }
      else {
        if (hVar11 == HASH_MANIFEST_OK) {
          pcVar15 = "Ok";
          local_598 = (uchar *)CONCAT44(local_598._4_4_,(int)CONCAT71(uVar20,1));
        }
        else {
          pcVar15 = "?";
          if (hVar11 == HASH_MANIFEST_NOT_FOUND) {
            pcVar15 = "Not Found";
          }
          local_598 = (uchar *)((ulong)local_598._4_4_ << 0x20);
        }
        bVar7 = 0;
      }
      printf("%-8s  %-s  %s  -  %s\n","xxh64",result_1,params.input._M_dataplus._M_p,pcVar15);
    }
  }
  if (params.sha1 == true) {
    pbVar24 = (byte *)hex_result;
    SHA1Final(pbVar24,(SHA1_CTX *)&arg_prefix);
    puVar27 = uuidv5_namespace;
    for (sVar25 = 0x29; sVar25 != 1; sVar25 = sVar25 - 2) {
      snprintf((char *)puVar27,sVar25,"%02x",(ulong)*pbVar24);
      pbVar24 = pbVar24 + 1;
      puVar27 = puVar27 + 2;
    }
    if (params.manifest_is_usable == false) {
      printf("%-8s  %-s  %s\n","sha1",uuidv5_namespace,params.input._M_dataplus._M_p);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&tensor_layer_name,"sha1",(allocator<char> *)result);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)result_1,(char *)uuidv5_namespace,&local_59e);
      hVar11 = manifest_verify(&params.manifest_file,&tensor_layer_name,(string *)result_1,
                               &params.input);
      std::__cxx11::string::~string((string *)result_1);
      uVar18 = std::__cxx11::string::~string((string *)&tensor_layer_name);
      uVar20 = (undefined7)((ulong)uVar18 >> 8);
      if (hVar11 == HASH_MANIFEST_MISMATCH) {
        pcVar15 = "Mismatch";
        local_598 = (uchar *)CONCAT44(local_598._4_4_,(int)CONCAT71(uVar20,1));
        bVar7 = 1;
      }
      else if (hVar11 == HASH_MANIFEST_OK) {
        pcVar15 = "Ok";
        local_598 = (uchar *)CONCAT44(local_598._4_4_,(int)CONCAT71(uVar20,1));
      }
      else {
        pcVar15 = "?";
        if (hVar11 == HASH_MANIFEST_NOT_FOUND) {
          pcVar15 = "Not Found";
        }
      }
      printf("%-8s  %-s  %s  -  %s\n","sha1",uuidv5_namespace,params.input._M_dataplus._M_p,pcVar15)
      ;
    }
  }
  if (params.sha256 == true) {
    digest = &tensor_layer_name;
    sha256_final((sha256_t *)&arg,(uchar *)digest);
    puVar27 = uuidv5_namespace;
    local_4e8 = 0;
    uStack_4e0 = 0;
    uStack_4f7 = 0;
    uStack_4f3 = 0;
    uStack_4ef = 0;
    local_508._0_8_ = 0;
    local_508[8] = '\0';
    local_508._9_4_ = 0;
    local_508._13_4_ = 0;
    uuidv5_namespace[0] = '\0';
    uuidv5_namespace[1] = '\0';
    uuidv5_namespace[2] = '\0';
    uuidv5_namespace[3] = '\0';
    uuidv5_namespace[4] = '\0';
    uuidv5_namespace[5] = '\0';
    uuidv5_namespace[6] = '\0';
    uuidv5_namespace[7] = '\0';
    uuidv5_namespace[8] = '\0';
    uuidv5_namespace[9] = '\0';
    uuidv5_namespace[10] = '\0';
    uuidv5_namespace[0xb] = '\0';
    uuidv5_namespace[0xc] = '\0';
    uuidv5_namespace[0xd] = '\0';
    uuidv5_namespace[0xe] = '\0';
    uuidv5_namespace[0xf] = '\0';
    local_4d8 = 0;
    for (sVar25 = 0x41; sVar25 != 1; sVar25 = sVar25 - 2) {
      snprintf((char *)puVar27,sVar25,"%02x",(ulong)*(byte *)&(digest->_M_dataplus)._M_p);
      digest = (string *)((long)&(digest->_M_dataplus)._M_p + 1);
      puVar27 = puVar27 + 2;
    }
    if (params.manifest_is_usable == false) {
      printf("%-8s  %-s  %s\n","sha256",uuidv5_namespace,params.input._M_dataplus._M_p);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)result_1,"sha256",(allocator<char> *)result);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)hex_result,(char *)uuidv5_namespace,&local_59e);
      hVar11 = manifest_verify(&params.manifest_file,(string *)result_1,(string *)hex_result,
                               &params.input);
      std::__cxx11::string::~string((string *)hex_result);
      uVar18 = std::__cxx11::string::~string((string *)result_1);
      uVar20 = (undefined7)((ulong)uVar18 >> 8);
      if (hVar11 == HASH_MANIFEST_MISMATCH) {
        pcVar15 = "Mismatch";
        local_598 = (uchar *)CONCAT44(local_598._4_4_,(int)CONCAT71(uVar20,1));
        bVar7 = 1;
      }
      else if (hVar11 == HASH_MANIFEST_OK) {
        pcVar15 = "Ok";
        local_598 = (uchar *)CONCAT44(local_598._4_4_,(int)CONCAT71(uVar20,1));
      }
      else {
        pcVar15 = "?";
        if (hVar11 == HASH_MANIFEST_NOT_FOUND) {
          pcVar15 = "Not Found";
        }
      }
      printf("%-8s  %-s  %s  -  %s\n","sha256",uuidv5_namespace,params.input._M_dataplus._M_p,
             pcVar15);
    }
  }
  if (params.uuid == true) {
    SHA1Final((uchar *)hex_result,(SHA1_CTX *)&manifest_entry_line);
    for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
      result[lVar16] = hex_result[lVar16];
    }
    local_508._0_8_ = 0;
    local_508[8] = '\0';
    local_508._9_4_ = 0;
    local_508._13_4_ = 0;
    uStack_4f7 = 0;
    uuidv5_namespace[0] = '\0';
    uuidv5_namespace[1] = '\0';
    uuidv5_namespace[2] = '\0';
    uuidv5_namespace[3] = '\0';
    uuidv5_namespace[4] = '\0';
    uuidv5_namespace[5] = '\0';
    uuidv5_namespace[6] = '\0';
    uuidv5_namespace[7] = '\0';
    uuidv5_namespace[8] = '\0';
    uuidv5_namespace[9] = '\0';
    uuidv5_namespace[10] = '\0';
    uuidv5_namespace[0xb] = '\0';
    uuidv5_namespace[0xc] = '\0';
    uuidv5_namespace[0xd] = '\0';
    uuidv5_namespace[0xe] = '\0';
    uuidv5_namespace[0xf] = '\0';
    local_588 = uVar26;
    snprintf((char *)uuidv5_namespace,0x25,
             "%02x%02x%02x%02x-%02x%02x-%02x%02x-%02x%02x-%02x%02x%02x%02x%02x%02x",
             (ulong)(byte)result[0],(ulong)(byte)result[1],(ulong)(byte)result[2],
             (ulong)(byte)result[3],(ulong)(byte)result[4],(ulong)(byte)result[5],
             (ulong)((byte)result[6] & 0xf | 0x50),(ulong)(byte)result[7],
             (ulong)((byte)result[8] & 0x3f | 0x80),(ulong)(byte)result[9],(ulong)(byte)result[10],
             (ulong)(byte)result[0xb],(ulong)(byte)result[0xc],(ulong)(byte)result[0xd],
             (ulong)(byte)result[0xe],(ulong)(byte)result[0xf]);
    if (params.manifest_is_usable == true) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&tensor_layer_name,"sha256",&local_59e);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)result_1,(char *)uuidv5_namespace,(allocator<char> *)(local_59d + 4));
      uVar26 = local_588;
      pcVar15 = "?";
      hVar11 = manifest_verify(&params.manifest_file,&tensor_layer_name,(string *)result_1,
                               &params.input);
      std::__cxx11::string::~string((string *)result_1);
      uVar18 = std::__cxx11::string::~string((string *)&tensor_layer_name);
      uVar20 = (undefined7)((ulong)uVar18 >> 8);
      if (hVar11 == HASH_MANIFEST_MISMATCH) {
        pcVar15 = "Mismatch";
        local_598 = (uchar *)CONCAT44(local_598._4_4_,(int)CONCAT71(uVar20,1));
        bVar7 = 1;
      }
      else if (hVar11 == HASH_MANIFEST_OK) {
        pcVar15 = "Ok";
        local_598 = (uchar *)CONCAT44(local_598._4_4_,(int)CONCAT71(uVar20,1));
      }
      else if (hVar11 == HASH_MANIFEST_NOT_FOUND) {
        pcVar15 = "Not Found";
      }
      printf("%-8s  %-s  %s  -  %s\n","uuid",uuidv5_namespace,params.input._M_dataplus._M_p,pcVar15)
      ;
    }
    else {
      printf("%-8s  %-s  %s\n","uuid",uuidv5_namespace,params.input._M_dataplus._M_p);
      uVar26 = local_588;
    }
  }
  ggml_free(ctx_data);
  gguf_free(uVar13);
  if (params.manifest_is_usable != true) {
    uVar10 = 0;
    goto LAB_00103731;
  }
  if ((char)local_598 == '\0') {
    bVar7 = (byte)uVar26;
    if ((local_590 & 1) != 0) goto LAB_00103704;
    pcVar15 = "Manifest Missing Entry";
    uVar10 = 3;
  }
  else if (((local_590 & 1) == 0) || ((uVar26 & 1) == 0)) {
LAB_00103704:
    uVar10 = (uint)(bVar7 & 1);
    pcVar15 = "Failure";
    if ((bVar7 & 1) == 0) {
      pcVar15 = "Success";
    }
  }
  else {
    pcVar15 = "Failure";
    uVar10 = 1;
  }
  printf("\nVerification results for %s - %s\n",params.manifest_file._M_dataplus._M_p,pcVar15);
LAB_00103731:
  hash_params::~hash_params(&params);
  return uVar10;
}

Assistant:

int main(int argc, const char ** argv) {
    hash_params params;
    manifest_check_params manifest_check;
    hash_params_parse(argc, argv, params);

    if (!params.manifest_file.empty()) {
        if (!manifest_type(params.manifest_file, manifest_check)) {
            printf("ERROR cannot open manifest %s", params.manifest_file.c_str());
            return HASH_EXIT_MANIFEST_FILE_ERROR;
        }

        if (!manifest_check.sha256 && !manifest_check.sha1 && !manifest_check.xxh64 && !manifest_check.uuid) {
            printf("ERROR manifest does not have any known hash format in %s", params.manifest_file.c_str());
            return HASH_EXIT_MANIFEST_UNKNOWN_HASH;
        }

        printf("manifest  %s", params.manifest_file.c_str());

        if (manifest_check.sha256) {
            printf("  sha256");
        }

        if (manifest_check.sha1) {
            printf("  sha1");
        }

        if (manifest_check.xxh64) {
            printf("  xxh64");
        }

        if (manifest_check.uuid) {
            printf("  uuid");
        }

        printf("\n");

        // Autoselect the highest security hash if manifest is provided but
        // the user has not specifically defined the hash they care about
        if (!params.xxh64 && !params.sha1 && !params.uuid && !params.sha256) {
            // User has not selected a specific value, pick most secure hash
            if (manifest_check.sha256) {
                params.sha256 = true;
            } else if (manifest_check.sha1) {
                params.sha1 = true;
            } else if (manifest_check.xxh64) {
                params.xxh64 = true;
            } else if (manifest_check.uuid) {
                params.uuid = true;
            }
        }

        params.manifest_is_usable = true;
    }

    // By default if no swich argument provided, assume xxh64
    if (!params.xxh64 && !params.sha1 && !params.uuid && !params.sha256) {
        params.xxh64 = true;
    }

    hash_exit_code_t exit_code = gguf_hash(params);

    if (params.manifest_is_usable) {
        printf("\nVerification results for %s - %s\n", params.manifest_file.c_str(), hash_exit_code_to_str(exit_code));
    }

    return exit_code;
}